

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::asBool(Value *this)

{
  string *msg;
  double *in_RDI;
  ostringstream oss;
  string local_1b8 [48];
  ostringstream local_188 [391];
  bool local_1;
  
  msg = (string *)(ulong)*(byte *)(in_RDI + 1);
  switch(msg) {
  case (string *)0x0:
    local_1 = false;
    break;
  case (string *)0x1:
    local_1 = *in_RDI != 0.0;
    break;
  case (string *)0x2:
    local_1 = *in_RDI != 0.0;
    break;
  case (string *)0x3:
    local_1 = *in_RDI != 0.0;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::operator<<((ostream *)local_188,"Value is not convertible to bool.");
    std::__cxx11::ostringstream::str();
    throwLogicError(msg);
    std::__cxx11::string::~string(local_1b8);
    abort();
  case (string *)0x5:
    local_1 = (bool)(*(byte *)in_RDI & 1);
  }
  return local_1;
}

Assistant:

bool Value::asBool() const {
  switch (type_) {
  case booleanValue:
    return value_.bool_;
  case nullValue:
    return false;
  case intValue:
    return value_.int_ ? true : false;
  case uintValue:
    return value_.uint_ ? true : false;
  case realValue:
    return value_.real_ ? true : false;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to bool.");
}